

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O0

void DoSaveKeys(FConfigFile *config,char *section,FKeySection *keysection,bool dbl)

{
  uint uVar1;
  FKeyBindings *this;
  FKeyAction *pFVar2;
  char *matchcmd;
  uint local_34;
  uint i;
  FKeyBindings *bindings;
  bool dbl_local;
  FKeySection *keysection_local;
  char *section_local;
  FConfigFile *config_local;
  
  FConfigFile::SetSection(config,section,true);
  FConfigFile::ClearCurrentSection(config);
  this = &Bindings;
  if (dbl) {
    this = &DoubleBindings;
  }
  local_34 = 0;
  while( true ) {
    uVar1 = TArray<FKeyAction,_FKeyAction>::Size(&keysection->mActions);
    if (uVar1 <= local_34) break;
    pFVar2 = TArray<FKeyAction,_FKeyAction>::operator[](&keysection->mActions,(ulong)local_34);
    matchcmd = FString::operator_cast_to_char_(&pFVar2->mAction);
    FKeyBindings::ArchiveBindings(this,config,matchcmd);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

static void DoSaveKeys (FConfigFile *config, const char *section, FKeySection *keysection, bool dbl)
{
	config->SetSection (section, true);
	config->ClearCurrentSection ();
	FKeyBindings *bindings = dbl? &DoubleBindings : &Bindings;
	for (unsigned i = 0; i < keysection->mActions.Size(); ++i)
	{
		bindings->ArchiveBindings (config, keysection->mActions[i].mAction);
	}
}